

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedatabase.cpp
# Opt level: O0

QMimeType __thiscall
QMimeDatabasePrivate::mimeTypeForFileNameAndData
          (QMimeDatabasePrivate *this,QString *fileName,QIODevice *device)

{
  bool bVar1;
  qsizetype qVar2;
  QString *in_RCX;
  QMimeDatabasePrivate *in_RDX;
  anon_class_16_2_b95a222d *in_RSI;
  QMimeDatabasePrivate *in_RDI;
  long in_FS_OFFSET;
  QMimeType *mime;
  QFile fallbackFile;
  anon_class_16_2_b95a222d matchOnContent;
  QMimeGlobMatchResult candidatesByName;
  QMimeGlobMatchResult *in_stack_fffffffffffffed8;
  QMimeGlobMatchResult *in_stack_fffffffffffffee0;
  QExplicitlySharedDataPointer<QMimeTypePrivate> this_00;
  anon_class_16_2_b95a222d *nameOrAlias;
  QMimeDatabasePrivate *this_01;
  QIODevice *in_stack_ffffffffffffff50;
  QIODevice *device_00;
  QMimeGlobMatchResult local_98;
  undefined1 local_50 [24];
  QList<QString> aQStack_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00.d.ptr =
       (totally_ordered_wrapper<QMimeTypePrivate_*>)
       (totally_ordered_wrapper<QMimeTypePrivate_*>)in_RDI;
  nameOrAlias = in_RSI;
  this_01 = in_RDI;
  memset(local_50,0xaa,0x48);
  findByFileName(in_RDX,in_RCX);
  qVar2 = QList<QString>::size(aQStack_38);
  if (qVar2 == 1) {
    *(undefined1 **)&(in_RDI->m_defaultMimeType).d.d = &DAT_aaaaaaaaaaaaaaaa;
    QList<QString>::at(&in_stack_fffffffffffffee0->m_matchingMimeTypes,
                       (qsizetype)in_stack_fffffffffffffed8);
    mimeTypeForName(this_01,(QString *)nameOrAlias);
    bVar1 = QMimeType::isValid((QMimeType *)0x8e5346);
    if (bVar1) goto LAB_008e5526;
    in_stack_fffffffffffffee0 = &local_98;
    memset(in_stack_fffffffffffffee0,0,0x18);
    QList<QString>::QList((QList<QString> *)0x8e53c3);
    memset(&local_98.m_allMatchingMimeTypes,0,0x18);
    QList<QString>::QList((QList<QString> *)0x8e53ea);
    local_98.m_weight = 0;
    local_98.m_matchingPatternLength = 0;
    local_98.m_knownSuffixLength = 0;
    QMimeGlobMatchResult::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    QMimeGlobMatchResult::~QMimeGlobMatchResult(in_stack_fffffffffffffee0);
    QMimeType::~QMimeType((QMimeType *)0x8e5448);
  }
  if (in_RCX == (QString *)0x0) {
    device_00 = (QIODevice *)&DAT_aaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)this_00.d.ptr,&in_RDI->m_defaultMimeType);
    mimeTypeForFileNameAndData::anon_class_16_2_b95a222d::operator()(in_RSI,device_00);
    QFile::~QFile((QFile *)0x8e5506);
  }
  else {
    mimeTypeForFileNameAndData::anon_class_16_2_b95a222d::operator()
              (in_RSI,in_stack_ffffffffffffff50);
  }
LAB_008e5526:
  QMimeGlobMatchResult::~QMimeGlobMatchResult(in_stack_fffffffffffffee0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QExplicitlySharedDataPointer<QMimeTypePrivate>)
           (QExplicitlySharedDataPointer<QMimeTypePrivate>)this_00.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QMimeType QMimeDatabasePrivate::mimeTypeForFileNameAndData(const QString &fileName, QIODevice *device)
{
    // First, glob patterns are evaluated. If there is a match with max weight,
    // this one is selected and we are done. Otherwise, the file contents are
    // evaluated and the match with the highest value (either a magic priority or
    // a glob pattern weight) is selected. Matching starts from max level (most
    // specific) in both cases, even when there is already a suffix matching candidate.

    // Pass 1) Try to match on the file name
    QMimeGlobMatchResult candidatesByName = findByFileName(fileName);
    if (candidatesByName.m_allMatchingMimeTypes.size() == 1) {
        const QMimeType mime = mimeTypeForName(candidatesByName.m_matchingMimeTypes.at(0));
        if (mime.isValid())
            return mime;
        candidatesByName = {};
    }

    // Extension is unknown, or matches multiple mimetypes.
    // Pass 2) Match on content, if we can read the data
    const auto matchOnContent = [this, &candidatesByName](QIODevice *device) {
        const bool openedByUs = !device->isOpen() && device->open(QIODevice::ReadOnly);
        if (device->isOpen()) {
            // Read 16K in one go (QIODEVICE_BUFFERSIZE in qiodevice_p.h).
            // This is much faster than seeking back and forth into QIODevice.
            const QByteArray data = device->peek(16384);

            if (openedByUs)
                device->close();

            int magicAccuracy = 0;
            QMimeType candidateByData(findByData(data, &magicAccuracy));

            // Disambiguate conflicting extensions (if magic matching found something)
            if (candidateByData.isValid() && magicAccuracy > 0) {
                const QString sniffedMime = candidateByData.name();
                // If the sniffedMime matches a highest-weight glob match, use it
                if (candidatesByName.m_matchingMimeTypes.contains(sniffedMime)) {
                    return candidateByData;
                }
                for (const QString &m : std::as_const(candidatesByName.m_allMatchingMimeTypes)) {
                    if (inherits(m, sniffedMime)) {
                        // We have magic + pattern pointing to this, so it's a pretty good match
                        return mimeTypeForName(m);
                    }
                }
                if (candidatesByName.m_allMatchingMimeTypes.isEmpty()) {
                    // No glob, use magic
                    return candidateByData;
                }
            }
        }

        if (candidatesByName.m_allMatchingMimeTypes.size() > 1) {
            candidatesByName.m_matchingMimeTypes.sort(); // make it deterministic
            const QMimeType mime = mimeTypeForName(candidatesByName.m_matchingMimeTypes.at(0));
            if (mime.isValid())
                return mime;
        }

        return mimeTypeForName(defaultMimeType());
    };

    if (device)
        return matchOnContent(device);

    QFile fallbackFile(fileName);
    return matchOnContent(&fallbackFile);
}